

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlUnicode.c
# Opt level: O1

JL_STATUS JlUnicodeCharFromUtf8
                    (char *Utf8String,size_t Utf8StringLength,uint32_t *pUnicodeValue,
                    size_t *pNumBytesUsed)

{
  bool bVar1;
  bool bVar2;
  JL_STATUS JVar3;
  uint uVar4;
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  
  bVar6 = *Utf8String;
  if ((bVar6 & 0xf8) == 0xf0) {
    bVar6 = bVar6 & 7;
    uVar5 = 4;
  }
  else if ((bVar6 & 0xf0) == 0xe0) {
    bVar6 = bVar6 & 0xf;
    uVar5 = 3;
  }
  else {
    if ((bVar6 & 0xe0) != 0xc0) {
      JVar3 = JL_STATUS_SUCCESS;
      if ((char)bVar6 < '\0') {
        JVar3 = JL_STATUS_INVALID_DATA;
        bVar1 = false;
        uVar5 = 0;
        bVar6 = 0;
        bVar2 = false;
      }
      else {
        bVar2 = true;
        uVar5 = 1;
        bVar1 = false;
      }
      goto LAB_00105a9e;
    }
    bVar6 = bVar6 & 0x1f;
    uVar5 = 2;
  }
  JVar3 = JL_STATUS_SUCCESS;
  bVar1 = true;
  bVar2 = true;
LAB_00105a9e:
  if ((bVar2) && (JVar3 = JL_STATUS_INVALID_DATA, uVar5 <= Utf8StringLength)) {
    uVar4 = (uint)bVar6;
    JVar3 = JL_STATUS_SUCCESS;
    if (bVar1) {
      uVar7 = (uint)(byte)Utf8String[1];
      if ((Utf8String[1] & 0xc0U) == 0x80) {
        uVar8 = 2;
        do {
          uVar4 = uVar7 & 0x3f | uVar4 << 6;
          bVar1 = uVar8 < uVar5;
          if (uVar5 <= uVar8) goto LAB_00105b11;
          uVar7 = (uint)(byte)Utf8String[uVar8];
          uVar8 = uVar8 + 1;
        } while ((uVar7 & 0xffffffc0) == 0x80);
      }
      JVar3 = JL_STATUS_INVALID_DATA;
    }
LAB_00105b11:
    if ((!bVar1) &&
       (JVar3 = JL_STATUS_INVALID_DATA, uVar4 - 0xe000 < 0xfffff800 && uVar4 < 0x110000)) {
      *pUnicodeValue = uVar4;
      *pNumBytesUsed = uVar5;
      JVar3 = JL_STATUS_SUCCESS;
    }
  }
  return JVar3;
}

Assistant:

JL_STATUS
    JlUnicodeCharFromUtf8
    (
        char const*     Utf8String,
        size_t          Utf8StringLength,
        uint32_t*       pUnicodeValue,
        size_t*         pNumBytesUsed
    )
{
    // Determine number of bytes needed.
    // We assume Utf8StringLength is at least 1 byte long.
    size_t numBytesNeeded = 0;
    uint8_t topBits = 0;
    JL_STATUS jlStatus;

    if( 0xf0 == (Utf8String[0] & 0xf8) )
    {
        numBytesNeeded = 4;
        topBits = Utf8String[0] & 0x07;
        jlStatus = JL_STATUS_SUCCESS;
    }
    else if( 0xe0 == (Utf8String[0] & 0xf0) )
    {
        numBytesNeeded = 3;
        topBits = Utf8String[0] & 0x0f;
        jlStatus = JL_STATUS_SUCCESS;
    }
    else if( 0xc0 == (Utf8String[0] & 0xe0) )
    {
        numBytesNeeded = 2;
        topBits = Utf8String[0] & 0x1f;
        jlStatus = JL_STATUS_SUCCESS;
    }
    else if( 0x00 == (Utf8String[0] & 0x80) )
    {
        numBytesNeeded = 1;
        topBits = Utf8String[0] & 0x7f;
        jlStatus = JL_STATUS_SUCCESS;
    }
    else
    {
        // Is either a continuation character without a start, or an invalid start such as
        // a 5 or 6 byte character which is not valid in UTF8
        jlStatus = JL_STATUS_INVALID_DATA;
    }

    if( JL_STATUS_SUCCESS == jlStatus )
    {
        if( numBytesNeeded <= Utf8StringLength )
        {
            // Start with the top bits
            uint32_t unicode = topBits;

            /// Now slide in the next bits in sets of 6 for each continuation character
            for( uint32_t i=1; i<numBytesNeeded; i++ )
            {
                // Verify that this is a continuation utf8 char
                if( 0x80 == (Utf8String[i] & 0xc0) )
                {
                    unicode <<= 6;
                    unicode |= (Utf8String[i] & 0x3f );
                }
                else
                {
                    // Not a continuation character. This is invalid UTF8
                    jlStatus = JL_STATUS_INVALID_DATA;
                    break;
                }
            }

            if( JL_STATUS_SUCCESS == jlStatus )
            {
                if(     unicode <= 0x10ffff
                    &&  (unicode < 0xd800 || unicode > 0xdfff) )
                {
                    // Valid unicode range (We don't allow UTF16 surrogate pairs to appear in the utf8)
                    *pUnicodeValue = unicode;
                    *pNumBytesUsed = numBytesNeeded;
                }
                else
                {
                    jlStatus = JL_STATUS_INVALID_DATA;
                }
            }
        }
        else
        {
            // Not enough bytes to complete utf8 character
            jlStatus = JL_STATUS_INVALID_DATA;
        }
    }

    return jlStatus;
}